

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::Animatable<tinyusdz::value::AssetPath>::Animatable
          (Animatable<tinyusdz::value::AssetPath> *this,AssetPath *v)

{
  (this->_value).resolved_path_._M_dataplus._M_p = (pointer)0x0;
  (this->_value).resolved_path_._M_string_length = 0;
  (this->_value).resolved_path_.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this->_value).resolved_path_.field_2 + 8) = 0;
  (this->_value).asset_path_.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this->_value).asset_path_.field_2 + 8) = 0;
  (this->_value).asset_path_._M_dataplus._M_p = (pointer)&(this->_value).asset_path_.field_2;
  (this->_value).asset_path_._M_string_length = 0;
  (this->_value).resolved_path_._M_dataplus._M_p = (pointer)&(this->_value).resolved_path_.field_2;
  (this->_value).resolved_path_.field_2._M_local_buf[0] = '\0';
  this->_has_value = false;
  this->_blocked = false;
  (this->_ts)._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_ts)._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->_ts)._samples.
           super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->_ts)._samples.
           super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  set(this,v);
  return;
}

Assistant:

Animatable(const T &v) {
    set(v);
  }